

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O1

void __thiscall
list_buildable_dependencies_actions::module2
          (list_buildable_dependencies_actions *this,string *module)

{
  int iVar1;
  const_iterator cVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)module);
  if (iVar1 != 0) {
    cVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(this->buildable_)._M_t,module);
    if ((_Rb_tree_header *)cVar2._M_node != &(this->buildable_)._M_t._M_impl.super__Rb_tree_header)
    {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->deps_,module);
      return;
    }
    this->headers_ = true;
  }
  return;
}

Assistant:

void module2( std::string const & module )
    {
        if( module == "(unknown)" ) return;

        if( buildable_.count( module ) == 0 )
        {
            headers_ = true;
        }
        else
        {
            deps_.insert( module );
        }
    }